

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall
cmDocumentation::SetSection(cmDocumentation *this,char *name,cmDocumentationSection *section)

{
  cmDocumentationSection *this_00;
  
  this_00 = SectionAtName(this,name);
  std::__cxx11::string::operator=((string *)this_00,(string *)section);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::_M_move_assign
            (&this_00->Entries,&section->Entries);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 cmDocumentationSection section)
{
  this->SectionAtName(name) = std::move(section);
}